

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O2

void __thiscall
ary::PlaneTracker::initialize
          (PlaneTracker *this,Mat *image,SharedPlanarLocalization *localization,int id)

{
  Mat *pMVar1;
  undefined8 uVar2;
  pointer pPVar3;
  pointer pPVar4;
  _OutputArray *p_Var5;
  pointer pPVar6;
  int i;
  ulong uVar7;
  int mask_npoints;
  CameraUser local_170;
  Mat *local_158;
  CameraUser local_150;
  Matx31f translation;
  Point *mask_points_ptr;
  Matx33f rotation;
  undefined1 local_f8 [12];
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> mask_points;
  undefined8 local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  Size local_60;
  Point3_<float> local_48;
  Matx31f p;
  
  cv::Mat::clone();
  cv::Mat::operator=(&this->previous,(Mat *)local_f8);
  local_158 = image;
  cv::Mat::~Mat((Mat *)local_f8);
  PlanarLocalization::getPlaneCorners
            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_f8,
             (localization->super_shared_ptr<ary::PlanarLocalization>).
             super___shared_ptr<ary::PlanarLocalization,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
            (&this->plane_corners,
             (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_f8);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            ((_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_f8);
  PlanarLocalization::getPlaneSize
            ((localization->super_shared_ptr<ary::PlanarLocalization>).
             super___shared_ptr<ary::PlanarLocalization,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  (this->plane_size).width = (int)ROUND((float)local_f8._0_4_);
  (this->plane_size).height = (int)ROUND((float)local_f8._4_4_);
  pMVar1 = &this->mask;
  uVar2 = *(undefined8 *)(this->previous).size.p;
  local_80 = CONCAT44((int)uVar2,(int)((ulong)uVar2 >> 0x20));
  cv::Mat::create(pMVar1,&local_80,0);
  unique0x00004e80 = (pointer)&rotation;
  rotation.val[0] = 0.0;
  rotation.val[1] = 0.0;
  local_f8._0_4_ = -0x3efdfffa;
  local_e8 = 1.4013e-45;
  fStack_e4 = 1.4013e-45;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)pMVar1,(_InputArray *)local_f8);
  mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar4 = (this->plane_corners).
           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar6 = (this->plane_corners).
           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  mask_npoints = (int)((ulong)((long)pPVar6 - (long)pPVar4) >> 3);
  for (uVar7 = 0; uVar7 < (ulong)((long)pPVar6 - (long)pPVar4 >> 3); uVar7 = uVar7 + 1) {
    local_f8._0_4_ = (undefined4)pPVar4[uVar7].x;
    local_f8._4_4_ = (undefined4)pPVar4[uVar7].y;
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&mask_points,
               (Point_<int> *)local_f8);
    pPVar4 = (this->plane_corners).
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar6 = (this->plane_corners).
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  rotation.val[4] = 0.0;
  rotation.val[5] = 0.0;
  mask_points_ptr =
       mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  rotation.val[0] = 3.7909693e-37;
  rotation.val._8_8_ = pMVar1;
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)local_f8,255.0);
  local_78 = 0;
  cv::fillPoly(&rotation,&mask_points_ptr,&mask_npoints,1,local_f8,8,0,&local_78);
  local_e8 = 0.0;
  fStack_e4 = 0.0;
  local_f8._0_4_ = 0x1010000;
  local_f8._8_4_ = SUB84(local_158,0);
  fStack_ec = (float)((ulong)local_158 >> 0x20);
  rotation.val._8_8_ = &this->keypoints_current;
  rotation.val[4] = 0.0;
  rotation.val[5] = 0.0;
  local_60.width = 0;
  local_60.height = 0;
  rotation.val[0] = -9.624375e-38;
  local_70._0_4_ = 2.3693558e-38;
  local_70._8_8_ = pMVar1;
  cv::goodFeaturesToTrack
            ((_InputArray *)local_f8,(_OutputArray *)&rotation,1000,0.1,2.0,(_InputArray *)local_70,
             3,false,0.04);
  pPVar3 = (this->keypoints_start).
           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->keypoints_start).
      super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar3) {
    (this->keypoints_start).
    super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar3;
  }
  cv::Matx<float,_3,_3>::Matx((Matx<float,_3,_3> *)&rotation);
  cv::Matx<float,_3,_1>::Matx(&translation);
  (*(((localization->super_shared_ptr<ary::PlanarLocalization>).
      super___shared_ptr<ary::PlanarLocalization,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Localization)._vptr_Localization[2])((pointer)local_70);
  local_f8._0_4_ = -0x3efdfffb;
  local_e8 = 1.4013e-45;
  fStack_e4 = 4.2039e-45;
  local_170._vptr_CameraUser._0_4_ = 0xc2020005;
  local_170.camera.super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x300000003;
  local_170.camera.super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&rotation;
  unique0x10000822 = (pointer)local_70;
  p_Var5 = (_OutputArray *)cv::noArray();
  cv::Rodrigues((_InputArray *)local_f8,(_OutputArray *)&local_170,p_Var5);
  (*(((localization->super_shared_ptr<ary::PlanarLocalization>).
      super___shared_ptr<ary::PlanarLocalization,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Localization)._vptr_Localization[2])(local_f8);
  translation.val[2] = fStack_e4;
  translation.val[1] = local_e8;
  translation.val[0] = fStack_ec;
  cv::Matx<float,_3,_1>::Matx(&p);
  for (uVar7 = 0;
      pPVar4 = (this->keypoints_current).
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->keypoints_current).
                            super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3);
      uVar7 = uVar7 + 1) {
    local_150.camera.super_shared_ptr<ary::CameraModel>.
    super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pPVar4 + uVar7);
    CameraUser::getCameraModel(&local_170);
    CameraModel::getIntrinsics
              ((CameraModel *)
               CONCAT44(local_170._vptr_CameraUser._4_4_,local_170._vptr_CameraUser._0_4_));
    CameraUser::getCameraModel(&local_150);
    CameraModel::getDistortion((Mat *)local_f8,(CameraModel *)local_150._vptr_CameraUser);
    unprojectPoint((ary *)&local_48,
                   (Point2f *)
                   &local_150.camera.super_shared_ptr<ary::CameraModel>.
                    super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &rotation,&translation,(Matx33f *)local_70,(Mat *)local_f8);
    std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
    emplace_back<cv::Point3_<float>>
              ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)
               &this->keypoints_start,&local_48);
    cv::Mat::~Mat((Mat *)local_f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_150.camera);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_170.camera);
  }
  this->age = 0;
  this->identifier = id;
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&mask_points.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  return;
}

Assistant:

void PlaneTracker::initialize(const Mat& image, SharedPlanarLocalization localization, int id) {
	previous = image.clone();

	plane_corners = localization->getPlaneCorners();
	plane_size = localization->getPlaneSize();

	mask.create(previous.size(), CV_8UC1); mask.setTo(0);
	vector<Point> mask_points;
	int mask_npoints = plane_corners.size();
	for (int i = 0; i < plane_corners.size(); i++) {
		mask_points.push_back(Point(plane_corners[i].x, plane_corners[i].y));
	}
	const Point* mask_points_ptr = &(mask_points[0]);

	fillPoly(mask, &mask_points_ptr, &mask_npoints, 1, Scalar(255));
	goodFeaturesToTrack(image, keypoints_current, 1000, 0.1, 2, mask);

	keypoints_start.clear();

	Matx33f rotation;
	Matx31f translation;
	Rodrigues(localization->getCameraPosition().rotation, rotation);
	translation = localization->getCameraPosition().translation;

	Matx31f p;
	for (int i = 0; i < keypoints_current.size(); i++) {
		keypoints_start.push_back(unprojectPoint(keypoints_current[i], rotation, translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion()));
	}
/*
	vector<Point2f> image_points2;
	projectPoints(keypoints_start, camera.rotation, camera.translation, getCamera()->getIntrinsics(), getCamera()->getDistortion(), image_points2);

	Mat test;
	image.copyTo(test);

	for (int i = 0; i < keypoints_start.size(); i++) {
		line(test, image_points2[i], keypoints_current[i], Scalar(255), 2);
	cout <<  keypoints_current[i] << image_points2[i] << keypoints_start[i] << endl;

	}

	imshow("Test", test);
	waitKey(0);*/

    age = 0;
    identifier = id;

}